

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_neg(secp256k1_ge *r,secp256k1_ge *a)

{
  secp256k1_ge *in_RSI;
  void *in_RDI;
  secp256k1_fe *in_stack_ffffffffffffffe8;
  
  secp256k1_ge_verify(in_RSI);
  memcpy(in_RDI,in_RSI,0x68);
  secp256k1_fe_normalize_weak((secp256k1_fe *)0x104bea);
  secp256k1_fe_negate_unchecked(&in_RSI->x,in_stack_ffffffffffffffe8,0);
  secp256k1_ge_verify(in_RSI);
  return;
}

Assistant:

static void secp256k1_ge_neg(secp256k1_ge *r, const secp256k1_ge *a) {
    SECP256K1_GE_VERIFY(a);

    *r = *a;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);

    SECP256K1_GE_VERIFY(r);
}